

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_layout_row_template_push_variable(nk_context *ctx,float min_width)

{
  int iVar1;
  nk_panel *pnVar2;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x45e8,"void nk_layout_row_template_push_variable(struct nk_context *, float)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x45e9,"void nk_layout_row_template_push_variable(struct nk_context *, float)");
  }
  pnVar2 = ctx->current->layout;
  if (pnVar2 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x45ea,"void nk_layout_row_template_push_variable(struct nk_context *, float)");
  }
  if ((pnVar2->row).type == NK_LAYOUT_TEMPLATE) {
    iVar1 = (pnVar2->row).columns;
    if ((long)iVar1 < 0x10) {
      (pnVar2->row).columns = iVar1 + 1;
      (pnVar2->row).templates[iVar1] = -min_width;
      return;
    }
    __assert_fail("layout->row.columns < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x45f1,"void nk_layout_row_template_push_variable(struct nk_context *, float)");
  }
  __assert_fail("layout->row.type == NK_LAYOUT_TEMPLATE",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x45f0,"void nk_layout_row_template_push_variable(struct nk_context *, float)");
}

Assistant:

NK_API void
nk_layout_row_template_push_variable(struct nk_context *ctx, float min_width)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    NK_ASSERT(layout->row.type == NK_LAYOUT_TEMPLATE);
    NK_ASSERT(layout->row.columns < NK_MAX_LAYOUT_ROW_TEMPLATE_COLUMNS);
    if (layout->row.type != NK_LAYOUT_TEMPLATE) return;
    if (layout->row.columns >= NK_MAX_LAYOUT_ROW_TEMPLATE_COLUMNS) return;
    layout->row.templates[layout->row.columns++] = -min_width;
}